

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O1

bool __thiscall WorkerFlow::recv_notif(WorkerFlow *this)

{
  int iVar1;
  string *this_00;
  int *piVar2;
  char *__s;
  allocator<char> local_19;
  
  iVar1 = zmq_recv(this->m_notif_socket,this->m_buffer,this->m_buffsize,0);
  if (iVar1 != -1) {
    this->m_buffer[iVar1] = '\0';
    iVar1 = strcmp(this->m_buffer,"#\\");
    return iVar1 != 0;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __s = strerror(*piVar2);
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,&local_19);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool WorkerFlow::recv_notif()
{
    // Receive a message from the notification channel
    int size = zmq_recv(m_notif_socket, m_buffer, m_buffsize, 0);
    if (size == -1) {
        throw std::string(strerror(errno));
    }

    // set the last byte to 0 to terminate the buffer correctly. This value
    // should be never seen by others.
    m_buffer[size] = 0;

    // For now, we only support __EndOfTransmission__ message
    // This must be extendable and standarized!
    if (strcmp(m_buffer, "#\\") == 0) {
        return false;
    }

    // Other message is not considered
    return true;
}